

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

xmlDictPtr xmlDictCreate(void)

{
  uint uVar1;
  xmlDictPtr dict;
  
  xmlInitParser();
  dict = (xmlDictPtr)(*xmlMalloc)(0x40);
  if (dict == (xmlDictPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict->ref_counter = 1;
    dict->limit = 0;
    dict->size = 0;
    dict->nbElems = 0;
    dict->table = (xmlDictEntry *)0x0;
    dict->strings = (xmlDictStringsPtr_conflict)0x0;
    dict->subdict = (_xmlDict *)0x0;
    uVar1 = xmlRandom();
    dict->seed = uVar1;
  }
  return dict;
}

Assistant:

xmlDictPtr
xmlDictCreate(void) {
    xmlDictPtr dict;

    xmlInitParser();

    dict = xmlMalloc(sizeof(xmlDict));
    if (dict == NULL)
        return(NULL);
    dict->ref_counter = 1;
    dict->limit = 0;

    dict->size = 0;
    dict->nbElems = 0;
    dict->table = NULL;
    dict->strings = NULL;
    dict->subdict = NULL;
    dict->seed = xmlRandom();
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    dict->seed = 0;
#endif
    return(dict);
}